

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test::
iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test(iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test *this)

{
  iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test_0061c270;
  return;
}

Assistant:

IUTEST(SyntaxTest, ExceptionValueNE)
{
    if( int x = 1 )
        IUTEST_ASSERT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_THROW_VALUE_NE(throw 2, int, x) << x;
}